

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O3

void * asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                 (long *param_1,long param_2,ulong param_3)

{
  ulong uVar1;
  bool bVar2;
  void *pointer;
  void *__ptr;
  byte *pbVar3;
  undefined8 *puVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  bad_alloc ex;
  
  uVar1 = param_2 + 3;
  if (param_1 != (long *)0x0) {
    lVar8 = 0;
    bVar2 = true;
    do {
      bVar6 = bVar2;
      pbVar3 = (byte *)param_1[lVar8];
      if (((pbVar3 != (byte *)0x0) && (uVar1 >> 2 <= (ulong)*pbVar3)) &&
         ((ulong)pbVar3 % param_3 == 0)) {
        param_1[lVar8] = 0;
        bVar9 = *pbVar3;
        goto LAB_00147303;
      }
      lVar8 = 1;
      bVar2 = false;
    } while (bVar6);
    __ptr = (void *)*param_1;
    if (__ptr == (void *)0x0) {
      __ptr = (void *)param_1[1];
      lVar8 = 1;
      if (__ptr == (void *)0x0) goto LAB_001472b7;
    }
    else {
      lVar8 = 0;
    }
    param_1[lVar8] = 0;
    free(__ptr);
  }
LAB_001472b7:
  uVar7 = 0x10;
  if (0x10 < param_3) {
    uVar7 = param_3;
  }
  uVar5 = ((uVar1 & 0xfffffffffffffffc) + 1) % uVar7;
  lVar8 = uVar7 - uVar5;
  if (uVar5 == 0) {
    lVar8 = 0;
  }
  pbVar3 = (byte *)aligned_alloc(uVar7,lVar8 + (uVar1 & 0xfffffffffffffffc) + 1);
  if (pbVar3 == (byte *)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = __cxa_init_primary_exception;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  bVar9 = 0;
  if (uVar1 < 0x400) {
    bVar9 = (byte)(uVar1 >> 2);
  }
LAB_00147303:
  pbVar3[param_2] = bVar9;
  return pbVar3;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size, std::size_t align = ASIO_DEFAULT_ALIGN)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread)
    {
      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          unsigned char* const mem = static_cast<unsigned char*>(pointer);
          if (static_cast<std::size_t>(mem[0]) >= chunks
              && reinterpret_cast<std::size_t>(pointer) % align == 0)
          {
            this_thread->reusable_memory_[mem_index] = 0;
            mem[size] = mem[0];
            return pointer;
          }
        }
      }

      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          this_thread->reusable_memory_[mem_index] = 0;
          aligned_delete(pointer);
          break;
        }
      }
    }

    void* const pointer = aligned_new(align, chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }